

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O0

void update_one(chunk_conflict *c,loc grid,player *p)

{
  _Bool _Var1;
  square_conflict *psVar2;
  player *p_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  if (p->timed[2] == 0) {
    _Var1 = square_isseen((chunk *)c,(loc_conflict)grid);
    if (_Var1) {
      square_reveal_trap((chunk_conflict2 *)c,(loc_conflict)grid,false,true);
    }
  }
  else {
    psVar2 = square((chunk *)c,(loc_conflict)grid);
    flag_off(psVar2->info,3,5);
    psVar2 = square((chunk *)c,(loc_conflict)grid);
    flag_off(psVar2->info,3,0x15);
  }
  _Var1 = square_isseen((chunk *)c,(loc_conflict)grid);
  if ((_Var1) && (_Var1 = square_wasseen((chunk *)c,(loc_conflict)grid), !_Var1)) {
    _Var1 = square_isfeel((chunk *)c,(loc_conflict)grid);
    if (_Var1) {
      c->feeling_squares = c->feeling_squares + 1;
      psVar2 = square((chunk *)c,(loc_conflict)grid);
      flag_off(psVar2->info,3,8);
      if ((c->feeling_squares == z_info->feeling_need) && ((p->upkeep->only_partial & 1U) == 0)) {
        display_feeling(true);
        p->upkeep->redraw = p->upkeep->redraw | 0x1000000;
      }
    }
    square_note_spot((chunk *)c,grid);
    square_light_spot((chunk *)c,grid);
  }
  _Var1 = square_isseen((chunk *)c,(loc_conflict)grid);
  if ((!_Var1) && (_Var1 = square_wasseen((chunk *)c,(loc_conflict)grid), _Var1)) {
    square_light_spot((chunk *)c,grid);
  }
  psVar2 = square((chunk *)c,(loc_conflict)grid);
  flag_off(psVar2->info,3,7);
  return;
}

Assistant:

static void update_one(struct chunk *c, struct loc grid, struct player *p)
{
	/* Remove view if blind, check visible squares for traps */
	if (p->timed[TMD_BLIND]) {
		sqinfo_off(square(c, grid)->info, SQUARE_SEEN);
		sqinfo_off(square(c, grid)->info, SQUARE_CLOSE_PLAYER);
	} else if (square_isseen(c, grid)) {
		square_reveal_trap(c, grid, false, true);
	}

	/* Square went from unseen -> seen */
	if (square_isseen(c, grid) && !square_wasseen(c, grid)) {
		if (square_isfeel(c, grid)) {
			c->feeling_squares++;
			sqinfo_off(square(c, grid)->info, SQUARE_FEEL);
			/* Don't display feeling if it will display for the new level */
			if ((c->feeling_squares == z_info->feeling_need) &&
				!p->upkeep->only_partial) {
				display_feeling(true);
				p->upkeep->redraw |= PR_FEELING;
			}
		}

		square_note_spot(c, grid);
		square_light_spot(c, grid);
	}

	/* Square went from seen -> unseen */
	if (!square_isseen(c, grid) && square_wasseen(c, grid))
		square_light_spot(c, grid);

	sqinfo_off(square(c, grid)->info, SQUARE_WASSEEN);
}